

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

size_t phosg::parse_size(char *str)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  bVar1 = *str;
  lVar4 = 0;
  while( true ) {
    uVar2 = (uint)(char)bVar1;
    if (9 < uVar2 - 0x30) break;
    lVar4 = (ulong)(uVar2 - 0x30) + lVar4 * 10;
    bVar1 = ((byte *)str)[1];
    str = (char *)((byte *)str + 1);
  }
  dVar7 = 0.0;
  if (bVar1 == 0x2e) {
    uVar2 = (uint)(char)((byte *)str)[1];
    str = (char *)((byte *)str + 1);
    uVar5 = uVar2 - 0x30;
    if (uVar5 < 10) {
      dVar8 = 0.1;
      do {
        dVar7 = dVar7 + (double)(int)uVar5 * dVar8;
        dVar8 = dVar8 * 0.1;
        uVar2 = (uint)(char)((byte *)str)[1];
        str = (char *)((byte *)str + 1);
        uVar5 = uVar2 - 0x30;
      } while (uVar5 < 10);
    }
  }
  while (str = (char *)((byte *)str + 1), (char)uVar2 == ' ') {
    uVar2 = (uint)(byte)*str;
  }
  uVar2 = uVar2 & 0xff;
  if (uVar2 < 0x65) {
    switch(uVar2) {
    case 0x45:
switchD_0011099d_caseD_45:
      lVar3 = 0x1000000000000000;
      goto LAB_001109ff;
    case 0x46:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4c:
    case 0x4e:
    case 0x4f:
      break;
    case 0x47:
switchD_0011099d_caseD_47:
      lVar3 = 0x40000000;
      goto LAB_001109ff;
    case 0x4b:
switchD_0011099d_caseD_4b:
      lVar3 = 0x400;
      goto LAB_001109ff;
    case 0x4d:
switchD_0011099d_caseD_4d:
      lVar3 = 0x100000;
      goto LAB_001109ff;
    case 0x50:
switchD_0011099d_caseD_50:
      lVar3 = 0x4000000000000;
      goto LAB_001109ff;
    default:
      if (uVar2 == 0x54) {
LAB_001109f5:
        lVar3 = 0x10000000000;
        goto LAB_001109ff;
      }
    }
  }
  else {
    switch(uVar2) {
    case 0x65:
      goto switchD_0011099d_caseD_45;
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
      break;
    case 0x67:
      goto switchD_0011099d_caseD_47;
    case 0x6b:
      goto switchD_0011099d_caseD_4b;
    case 0x6d:
      goto switchD_0011099d_caseD_4d;
    case 0x70:
      goto switchD_0011099d_caseD_50;
    default:
      if (uVar2 == 0x74) goto LAB_001109f5;
    }
  }
  lVar3 = 1;
LAB_001109ff:
  uVar6 = (ulong)(dVar7 * (double)lVar3);
  return ((long)(dVar7 * (double)lVar3 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6) +
         lVar4 * lVar3;
}

Assistant:

size_t parse_size(const char* str) {
  // input is like [0-9](\.[0-9]+)? *[KkMmGgTtPpEe]?[Bb]?
  // fortunately this can just be parsed left-to-right
  double fractional_part = 0.0;
  size_t integer_part = 0;
  size_t unit_scale = 1;
  for (; isdigit(*str); str++) {
    integer_part = integer_part * 10 + (*str - '0');
  }
  if (*str == '.') {
    str++;
    double factor = 0.1;
    for (; isdigit(*str); str++) {
      fractional_part += factor * (*str - '0');
      factor *= 0.1;
    }
  }
  for (; *str == ' '; str++) {
  }
#if SIZE_T_BITS >= 16
  if (*str == 'K' || *str == 'k') {
    unit_scale = KB_SIZE;
#if SIZE_T_BITS >= 32
  } else if (*str == 'M' || *str == 'm') {
    unit_scale = MB_SIZE;
  } else if (*str == 'G' || *str == 'g') {
    unit_scale = GB_SIZE;
#if SIZE_T_BITS == 64
  } else if (*str == 'T' || *str == 't') {
    unit_scale = TB_SIZE;
  } else if (*str == 'P' || *str == 'p') {
    unit_scale = PB_SIZE;
  } else if (*str == 'E' || *str == 'e') {
    unit_scale = EB_SIZE;
#endif
#endif
  }
#endif

  return integer_part * unit_scale + static_cast<size_t>(fractional_part * unit_scale);
}